

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O2

U32 ZSTD_upscaleStat(uint *table,U32 lastEltIndex,int bonus)

{
  uint uVar1;
  U32 UVar2;
  ulong uVar3;
  
  UVar2 = 0;
  for (uVar3 = 0; lastEltIndex + 1 != uVar3; uVar3 = uVar3 + 1) {
    uVar1 = table[uVar3];
    table[uVar3] = uVar1 * 0x10 - 1;
    UVar2 = (UVar2 + uVar1 * 0x10) - 1;
  }
  return UVar2;
}

Assistant:

static U32 ZSTD_upscaleStat(unsigned* table, U32 lastEltIndex, int bonus)
{
    U32 s, sum=0;
    assert(ZSTD_FREQ_DIV+bonus >= 0);
    for (s=0; s<lastEltIndex+1; s++) {
        table[s] <<= ZSTD_FREQ_DIV+bonus;
        table[s]--;
        sum += table[s];
    }
    return sum;
}